

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

void vkt::texture::util::wrapCubemapCorner
               (IVec2 *coord,IVec2 *size,int faceNdx,int *adjacentFace1,int *adjacentFace2,
               IVec2 *cornerCoord0,IVec2 *cornerCoord1,IVec2 *cornerCoord2)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  Vector<int,_2> local_bc;
  Vector<int,_2> local_b4;
  undefined8 local_ac;
  Vector<int,_2> local_a4;
  Vector<int,_2> local_9c;
  Vector<int,_2> local_94;
  Vector<int,_2> local_8c;
  Vector<int,_2> local_84;
  IVec2 cornerFactor;
  int ndx;
  IVec2 *cornerCoords [3];
  int iStack_54;
  bool isFlipped;
  int faceEdge;
  int edgeNdx;
  int faceCorners [3];
  int cornerEdges [2];
  int cornerNdx;
  IVec2 *cornerCoord0_local;
  int *adjacentFace2_local;
  int *adjacentFace1_local;
  int faceNdx_local;
  IVec2 *size_local;
  IVec2 *coord_local;
  
  piVar2 = tcu::Vector<int,_2>::operator[](coord,0);
  if ((*piVar2 < 0) && (piVar2 = tcu::Vector<int,_2>::operator[](coord,1), *piVar2 < 0)) {
    cornerEdges[0] = 0;
  }
  else {
    piVar2 = tcu::Vector<int,_2>::operator[](coord,0);
    if ((*piVar2 < 1) || (piVar2 = tcu::Vector<int,_2>::operator[](coord,1), -1 < *piVar2)) {
      piVar2 = tcu::Vector<int,_2>::operator[](coord,0);
      if ((*piVar2 < 1) || (piVar2 = tcu::Vector<int,_2>::operator[](coord,1), *piVar2 < 1)) {
        cornerEdges[0] = 3;
      }
      else {
        cornerEdges[0] = 2;
      }
    }
    else {
      cornerEdges[0] = 1;
    }
  }
  faceCorners[1] = cornerEdges[0];
  faceCorners[2] = (cornerEdges[0] + 3U) % 4;
  faceEdge = cornerEdges[0];
  edgeNdx = 0;
  faceCorners[0] = 0;
  for (iStack_54 = 0; iStack_54 < 2; iStack_54 = iStack_54 + 1) {
    iVar1 = *(int *)((anonymous_namespace)::adjacentEdges +
                    (long)faceCorners[(long)iStack_54 + 1] * 4 + (long)faceNdx * 0x10);
    bVar3 = *(int *)((anonymous_namespace)::adjacentEdgeDirs +
                    (long)faceCorners[(long)iStack_54 + 1] * 4 + (long)faceNdx * 0x10) == -1;
    if (1 < faceCorners[(long)iStack_54 + 1] != 1 < iVar1) {
      bVar3 = !bVar3;
    }
    if (bVar3) {
      (&faceEdge)[iStack_54 + 1] = (iVar1 + 1) % 4;
    }
    else {
      (&faceEdge)[iStack_54 + 1] = iVar1;
    }
  }
  *adjacentFace1 =
       *(int *)((anonymous_namespace)::adjacentFaces +
               (long)cornerEdges[0] * 4 + (long)faceNdx * 0x10);
  *adjacentFace2 =
       *(int *)((anonymous_namespace)::adjacentFaces +
               (long)faceCorners[2] * 4 + (long)faceNdx * 0x10);
  unique0x10000360 = cornerCoord0;
  for (cornerFactor.m_data[0] = 0; cornerFactor.m_data[0] < 3;
      cornerFactor.m_data[0] = cornerFactor.m_data[0] + 1) {
    tcu::Vector<int,_2>::Vector(&local_84);
    switch((&faceEdge)[faceNdx]) {
    case 0:
      tcu::Vector<int,_2>::Vector(&local_8c,0,0);
      local_84.m_data[0] = local_8c.m_data[0];
      local_84.m_data[1] = local_8c.m_data[1];
      break;
    case 1:
      tcu::Vector<int,_2>::Vector(&local_94,1,0);
      local_84.m_data[0] = local_94.m_data[0];
      local_84.m_data[1] = local_94.m_data[1];
      break;
    case 2:
      tcu::Vector<int,_2>::Vector(&local_9c,1,1);
      local_84.m_data[0] = local_9c.m_data[0];
      local_84.m_data[1] = local_9c.m_data[1];
      break;
    case 3:
      tcu::Vector<int,_2>::Vector(&local_a4,0,1);
      local_84.m_data[0] = local_a4.m_data[0];
      local_84.m_data[1] = local_a4.m_data[1];
    }
    tcu::Vector<int,_2>::Vector(&local_bc,1);
    tcu::operator-((tcu *)&local_b4,size,&local_bc);
    tcu::operator*((tcu *)&local_ac,&local_84,&local_b4);
    **(undefined8 **)((&cornerFactor)[cornerFactor.m_data[0]].m_data + 1) = local_ac;
  }
  return;
}

Assistant:

void wrapCubemapCorner (const IVec2&	coord,
						const IVec2&	size,
						const int		faceNdx,
						int&			adjacentFace1,
						int&			adjacentFace2,
						IVec2&			cornerCoord0,
						IVec2&			cornerCoord1,
						IVec2&			cornerCoord2)
{
	int cornerNdx = -1;

	if (coord[0] < 0 && coord[1] < 0)
	{
		cornerNdx = 0;
	}
	else if (coord[0] > 0 && coord[1] < 0)
	{
		cornerNdx = 1;
	}
	else if (coord[0] > 0 && coord[1] > 0)
	{
		cornerNdx = 2;
	}
	else
	{
		cornerNdx = 3;
	}

	const int cornerEdges[2] = {cornerNdx, (int) ((cornerNdx + 3) % 4)};

	int		  faceCorners[3] = {cornerNdx, 0, 0};

	for (int edgeNdx = 0; edgeNdx < 2; ++edgeNdx)
	{
		const int faceEdge = adjacentEdges[faceNdx][cornerEdges[edgeNdx]];

		bool isFlipped = (adjacentEdgeDirs[faceNdx][cornerEdges[edgeNdx]] == -1);

		if ((cornerEdges[edgeNdx] > 1) != (faceEdge > 1))
		{
			isFlipped = !isFlipped;
		}

		if (isFlipped)
		{
			faceCorners[edgeNdx + 1] = (faceEdge + 1) % 4;
		}
		else
		{
			faceCorners[edgeNdx + 1] = faceEdge;
		}
	}

	adjacentFace1 = adjacentFaces[faceNdx][cornerEdges[0]];
	adjacentFace2 = adjacentFaces[faceNdx][cornerEdges[1]];

	IVec2* cornerCoords[3] = {&cornerCoord0, &cornerCoord1, &cornerCoord2};

	for (int ndx = 0; ndx < 3; ++ndx)
	{
		IVec2 cornerFactor;

		switch (faceCorners[faceNdx])
		{
			case 0:
				cornerFactor = IVec2(0, 0);
				break;

			case 1:
				cornerFactor = IVec2(1, 0);
				break;

			case 2:
				cornerFactor = IVec2(1, 1);
				break;

			case 3:
				cornerFactor = IVec2(0, 1);
				break;

			default:
				break;
		}

	    *cornerCoords[ndx] = cornerFactor * (size - IVec2(1));
	}
}